

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

int program_init(bov_window_t *window,int program_index,int n,...)

{
  GLuint object;
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  GLuint *local_120;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  uint local_48;
  undefined4 local_44;
  va_list vl;
  int local_28;
  int i;
  GLuint shaderProgram;
  int n_local;
  int program_index_local;
  bov_window_t *window_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  object = window->program[program_index];
  vl[0].overflow_arg_area = local_f8;
  vl[0]._0_8_ = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x18;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
    if (local_48 < 0x29) {
      local_120 = (GLuint *)((long)(int)local_48 + (long)vl[0].overflow_arg_area);
      local_48 = local_48 + 8;
    }
    else {
      local_120 = (GLuint *)vl[0]._0_8_;
      vl[0]._0_8_ = vl[0]._0_8_ + 8;
    }
    (*glad_glAttachShader)(object,*local_120);
  }
  (*glad_glBindFragDataLocation)(object,0,"outColor");
  (*glad_glLinkProgram)(object);
  iVar1 = checkivError(object,0x8b82,glad_glGetProgramiv,glad_glGetProgramInfoLog);
  if (iVar1 != 0) {
    bov_error_log(0x20002,"shader program %d creation failed",(ulong)(uint)program_index);
    fprintf(_stderr,"\t(in function %s, line %d)\n","program_init",0xcd);
  }
  window_local._4_4_ = (uint)(iVar1 != 0);
  return window_local._4_4_;
}

Assistant:

static int program_init(bov_window_t* window, int program_index, int n, ...)
{
	GLuint shaderProgram =  window->program[program_index];
	int i;
	va_list vl;

	va_start(vl,n);
	for (i=0; i<n; i++)
	{
		glAttachShader(shaderProgram, va_arg(vl,GLuint));
	}
	va_end(vl);

	glBindFragDataLocation(shaderProgram, 0, "outColor");
	glLinkProgram(shaderProgram);

	if(checkivError(shaderProgram,
	                GL_LINK_STATUS,
	                glGetProgramiv,
	                glGetProgramInfoLog)) {
		BOV_ERROR_LOG(BOV_SHADER_ERROR,
		              "shader program %d creation failed",
		              program_index);
		return 1;
	}

	return 0;
}